

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::UpdateMouseMovingWindowNewFrame(void)

{
  ImGuiViewportFlags *pIVar1;
  float fVar2;
  ImVec2 IVar3;
  ImGuiID id;
  ImGuiWindow *window;
  ImGuiContext *pIVar4;
  bool bVar5;
  ImGuiViewportP *pIVar6;
  float fVar7;
  float fVar8;
  ImVec2 pos;
  
  pIVar4 = GImGui;
  if (GImGui->MovingWindow == (ImGuiWindow *)0x0) {
    if (GImGui->ActiveIdWindow == (ImGuiWindow *)0x0) {
      return;
    }
    id = GImGui->ActiveIdWindow->MoveId;
    if (id != GImGui->ActiveId) {
      return;
    }
    KeepAliveID(id);
    if ((pIVar4->IO).MouseDown[0] != false) {
      return;
    }
    ClearActiveID();
    return;
  }
  KeepAliveID(GImGui->ActiveId);
  if ((pIVar4->MovingWindow == (ImGuiWindow *)0x0) ||
     (window = pIVar4->MovingWindow->RootWindow, window == (ImGuiWindow *)0x0)) {
    __assert_fail("g.MovingWindow && g.MovingWindow->RootWindow",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                  ,0xdd0,"void ImGui::UpdateMouseMovingWindowNewFrame()");
  }
  if (((pIVar4->IO).MouseDown[0] != true) ||
     (bVar5 = IsMousePosValid(&(pIVar4->IO).MousePos), !bVar5)) {
    if ((pIVar4->ConfigFlagsCurrFrame & 0x400) != 0) {
      UpdateTryMergeWindowIntoHostViewport(window,pIVar4->MouseViewport);
    }
    if ((GImGui->DragDropActive == true) && (GImGui->DragDropAcceptIdPrev != 0)) {
      pIVar6 = window->Viewport;
    }
    else {
      pIVar6 = window->Viewport;
      pIVar4->MouseViewport = pIVar6;
    }
    pIVar1 = &(pIVar6->super_ImGuiViewport).Flags;
    *(byte *)pIVar1 = (byte)*pIVar1 & 0xef;
    ClearActiveID();
    pIVar4->MovingWindow = (ImGuiWindow *)0x0;
    return;
  }
  IVar3 = (pIVar4->IO).MousePos;
  fVar7 = IVar3.x - (pIVar4->ActiveIdClickOffset).x;
  fVar8 = IVar3.y - (pIVar4->ActiveIdClickOffset).y;
  pos.y = fVar8;
  pos.x = fVar7;
  fVar2 = (window->Pos).x;
  if ((fVar2 == fVar7) && (!NAN(fVar2) && !NAN(fVar7))) {
    fVar2 = (window->Pos).y;
    if ((fVar2 == fVar8) && (!NAN(fVar2) && !NAN(fVar8))) goto LAB_0011ffa2;
  }
  IVar3.y = fVar8;
  IVar3.x = fVar7;
  MarkIniSettingsDirty(window);
  SetWindowPos(window,&pos,1);
  if (window->ViewportOwned == true) {
    (window->Viewport->super_ImGuiViewport).Pos = IVar3;
  }
LAB_0011ffa2:
  FocusWindow(pIVar4->MovingWindow);
  return;
}

Assistant:

void ImGui::UpdateMouseMovingWindowNewFrame()
{
    ImGuiContext& g = *GImGui;
    if (g.MovingWindow != NULL)
    {
        // We actually want to move the root window. g.MovingWindow == window we clicked on (could be a child window).
        // We track it to preserve Focus and so that generally ActiveIdWindow == MovingWindow and ActiveId == MovingWindow->MoveId for consistency.
        KeepAliveID(g.ActiveId);
        IM_ASSERT(g.MovingWindow && g.MovingWindow->RootWindow);
        ImGuiWindow* moving_window = g.MovingWindow->RootWindow;
        if (g.IO.MouseDown[0] && IsMousePosValid(&g.IO.MousePos))
        {
            ImVec2 pos = g.IO.MousePos - g.ActiveIdClickOffset;
            if (moving_window->Pos.x != pos.x || moving_window->Pos.y != pos.y)
            {
                MarkIniSettingsDirty(moving_window);
                SetWindowPos(moving_window, pos, ImGuiCond_Always);
                if (moving_window->ViewportOwned) // Synchronize viewport immediately because some overlays may relies on clipping rectangle before we Begin() into the window.
                    moving_window->Viewport->Pos = pos;
            }
            FocusWindow(g.MovingWindow);
        }
        else
        {
            // Try to merge the window back into the main viewport.
            // This works because MouseViewport should be != MovingWindow->Viewport on release (as per code in UpdateViewports)
            if (g.ConfigFlagsCurrFrame & ImGuiConfigFlags_ViewportsEnable)
                UpdateTryMergeWindowIntoHostViewport(moving_window, g.MouseViewport);

            // Restore the mouse viewport so that we don't hover the viewport _under_ the moved window during the frame we released the mouse button.
            if (!IsDragDropPayloadBeingAccepted())
                g.MouseViewport = moving_window->Viewport;

            // Clear the NoInput window flag set by the Viewport system
            moving_window->Viewport->Flags &= ~ImGuiViewportFlags_NoInputs; // FIXME-VIEWPORT: Test engine managed to crash here because Viewport was NULL.

            ClearActiveID();
            g.MovingWindow = NULL;
        }
    }
    else
    {
        // When clicking/dragging from a window that has the _NoMove flag, we still set the ActiveId in order to prevent hovering others.
        if (g.ActiveIdWindow && g.ActiveIdWindow->MoveId == g.ActiveId)
        {
            KeepAliveID(g.ActiveId);
            if (!g.IO.MouseDown[0])
                ClearActiveID();
        }
    }
}